

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::TriaO2::Global(MatrixXd *__return_storage_ptr__,TriaO2 *this,MatrixXd *local)

{
  bool bVar1;
  runtime_error *this_00;
  bool local_6f1;
  ConstRowXpr local_6f0;
  ConstRowXpr local_6b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_680;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>
  local_608;
  NestedExpressionType local_588;
  SquareReturnType local_580;
  MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_570;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>
  local_560;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_548;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
  local_538;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
  local_508;
  ConstColwiseReturnType local_448;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
  local_388;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  TriaO2 *this_local;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (TriaO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_6f1 = false;
  if (bVar1) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_6f1 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_6f1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,"local coordinates out of bounds for reference element");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
               &local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
               ,&local_279);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_250,&local_278,0x34,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_548 = Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->beta_,local_20);
  local_588 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
  Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::square
            (&local_580,
             (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_588);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::matrix(&local_570,
           (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
            *)&local_580);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
            (&local_560,(MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->gamma_,
             (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)&local_570);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
  ::operator+(&local_538,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
               *)&local_548,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
               *)&local_560);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_6b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_6f0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
  cwiseProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            (&local_680,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>> *)
             &local_6b8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_6f0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_608,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->delta_,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_680);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>const>,0>const>>
  ::operator+(&local_508,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,0>const>>
               *)&local_538,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
               *)&local_608);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>_>
  ::colwise(&local_448,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>_>
             *)&local_508);
  Eigen::
  VectorwiseOp<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>const,Eigen::Product<Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>,0>const>const,0>
  ::operator+(&local_388,
              (VectorwiseOp<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,0>
               *)&local_448,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->alpha_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>_>
              *)&local_388);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd TriaO2::Global(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");
  // Direct vectorized evaluation of componentwise quadratic mapping
  // given through its monomial coefficients.
  return ((beta_ * local) + (gamma_ * local.array().square().matrix()) +
          (delta_ * local.row(0).cwiseProduct(local.row(1))))
             .colwise() +
         alpha_;
}